

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O1

PList * p_hash_table_lookup_by_value(PHashTable *table,pconstpointer val,PCompareFunc func)

{
  pint pVar1;
  PList *list;
  PHashTableNode *pPVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((table == (PHashTable *)0x0) || (uVar3 = 0, table->size == 0)) {
    list = (PList *)0x0;
  }
  else {
    list = (PList *)0x0;
    do {
      for (pPVar2 = table->table[uVar3]; pPVar2 != (PHashTableNode *)0x0; pPVar2 = pPVar2->next) {
        if (func == (PCompareFunc)0x0) {
          bVar4 = pPVar2->value == val;
        }
        else {
          pVar1 = (*func)(pPVar2->value,val);
          bVar4 = pVar1 == 0;
        }
        if (bVar4) {
          list = p_list_append(list,pPVar2->key);
        }
      }
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 < table->size);
  }
  return list;
}

Assistant:

P_LIB_API PList *
p_hash_table_lookup_by_value (const PHashTable *table, pconstpointer val, PCompareFunc func)
{
	PList		*ret = NULL;
	PHashTableNode	*node;
	puint		i;
	pboolean	res;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	for (i = 0; i < table->size; ++i)
		for (node = table->table[i]; node != NULL; node = node->next) {
			if (func == NULL)
				res = (node->value == val);
			else
				res = (func (node->value, val) == 0);

			if (res)
				ret = p_list_append (ret, node->key);
		}

	return ret;
}